

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MutexFactory.cpp
# Opt level: O2

void __thiscall MutexLocker::~MutexLocker(MutexLocker *this)

{
  ~MutexLocker(this);
  operator_delete(this);
  return;
}

Assistant:

MutexLocker::~MutexLocker()
{
	if (mutex != NULL) mutex->unlock();
}